

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfg_validate.c
# Opt level: O2

int cfg_validate_acl(autobuf *out,char *section_name,char *entry_name,char *value,_Bool prefix,
                    int8_t *af_types,size_t af_types_count)

{
  int iVar1;
  netaddr_acl dummy;
  netaddr_acl local_58;
  
  iVar1 = netaddr_acl_handle_keywords(&local_58,value);
  if (iVar1 == 0) {
    iVar1 = 0;
  }
  else {
    if ((*value == '-') || (*value == '+')) {
      value = value + 1;
    }
    iVar1 = cfg_validate_netaddr(out,section_name,entry_name,value,prefix,af_types,af_types_count);
  }
  return iVar1;
}

Assistant:

int
cfg_validate_acl(struct autobuf *out, const char *section_name, const char *entry_name, const char *value, bool prefix,
  const int8_t *af_types, size_t af_types_count) {
  struct netaddr_acl dummy;

  if (netaddr_acl_handle_keywords(&dummy, value) == 0) {
    return 0;
  }

  if (*value == '+' || *value == '-') {
    return cfg_validate_netaddr(out, section_name, entry_name, &value[1], prefix, af_types, af_types_count);
  }

  return cfg_validate_netaddr(out, section_name, entry_name, value, prefix, af_types, af_types_count);
}